

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O3

bool __thiscall QThreadPoolPrivate::tryStart(QThreadPoolPrivate *this,QRunnable *task)

{
  QThreadPoolThread ***pppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  QThreadPoolThread *pQVar7;
  iterator iVar8;
  int iVar9;
  int iVar10;
  
  pDVar3 = (this->allThreads).q_hash.d;
  if ((pDVar3 != (Data *)0x0) && (sVar4 = pDVar3->size, sVar4 != 0)) {
    lVar5 = (this->waitingThreads).super_QList<QThreadPoolThread_*>.d.size;
    lVar6 = (this->expiredThreads).super_QList<QThreadPoolThread_*>.d.size;
    iVar9 = (((int)sVar4 - (int)lVar6) - (int)lVar5) + this->reservedThreads;
    iVar10 = 1;
    if (1 < this->requestedMaxThreadCount) {
      iVar10 = this->requestedMaxThreadCount;
    }
    if ((this->reservedThreads < iVar9) && (iVar10 <= iVar9)) {
      return false;
    }
    if (lVar5 != 0) {
      enqueueTask(this,task,0);
      iVar8 = QList<QThreadPoolThread_*>::begin
                        (&(this->waitingThreads).super_QList<QThreadPoolThread_*>);
      pQVar7 = *iVar8.i;
      pppQVar1 = &(this->waitingThreads).super_QList<QThreadPoolThread_*>.d.ptr;
      *pppQVar1 = *pppQVar1 + 1;
      pqVar2 = &(this->waitingThreads).super_QList<QThreadPoolThread_*>.d.size;
      *pqVar2 = *pqVar2 + -1;
      QWaitCondition::wakeOne(&pQVar7->runnableReady);
      return true;
    }
    if (lVar6 != 0) {
      iVar8 = QList<QThreadPoolThread_*>::begin
                        (&(this->expiredThreads).super_QList<QThreadPoolThread_*>);
      pQVar7 = *iVar8.i;
      pppQVar1 = &(this->expiredThreads).super_QList<QThreadPoolThread_*>.d.ptr;
      *pppQVar1 = *pppQVar1 + 1;
      pqVar2 = &(this->expiredThreads).super_QList<QThreadPoolThread_*>.d.size;
      *pqVar2 = *pqVar2 + -1;
      this->activeThreads = this->activeThreads + 1;
      pQVar7->runnable = task;
      QThread::wait(&pQVar7->super_QThread,(void *)0x7fffffffffffffff);
      QThread::start(&pQVar7->super_QThread,this->threadPriority);
      return true;
    }
  }
  startThread(this,task);
  return true;
}

Assistant:

bool QThreadPoolPrivate::tryStart(QRunnable *task)
{
    Q_ASSERT(task != nullptr);
    if (allThreads.isEmpty()) {
        // always create at least one thread
        startThread(task);
        return true;
    }

    // can't do anything if we're over the limit
    if (areAllThreadsActive())
        return false;

    if (!waitingThreads.isEmpty()) {
        // recycle an available thread
        enqueueTask(task);
        waitingThreads.takeFirst()->runnableReady.wakeOne();
        return true;
    }

    if (!expiredThreads.isEmpty()) {
        // restart an expired thread
        QThreadPoolThread *thread = expiredThreads.dequeue();
        Q_ASSERT(thread->runnable == nullptr);

        ++activeThreads;

        thread->runnable = task;

        // Ensure that the thread has actually finished, otherwise the following
        // start() has no effect.
        thread->wait();
        Q_ASSERT(thread->isFinished());
        thread->start(threadPriority);
        return true;
    }

    // start a new thread
    startThread(task);
    return true;
}